

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int ribesl(double x,double alpha,int nb,int ize,double *b)

{
  bool bVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  __type _Var5;
  double dVar6;
  double dVar7;
  double zero;
  double xlarge;
  double two;
  double tover;
  double total;
  double test;
  double tempc;
  double tempb;
  double tempa;
  double rtnsig;
  double psavel;
  double psave;
  double pold;
  double plast;
  double p;
  double one;
  int nstart;
  int nsig;
  int nend;
  int ncalc;
  int nbmx;
  int n;
  int magx;
  int l;
  int k;
  int i;
  double halfx;
  double half;
  bool flag;
  double exparg;
  double enten;
  double ensig;
  double enmten;
  double en;
  double emp2al;
  double empal;
  double em;
  double constant;
  double *b_local;
  int ize_local;
  int nb_local;
  double alpha_local;
  double x_local;
  
  if (nb < 1) {
    iVar3 = i4_min(nb,0);
    x_local._4_4_ = iVar3 + -1;
  }
  else if (0.0 <= x) {
    if (0.0 <= alpha) {
      if (alpha < 1.0) {
        if ((ize != 1) || (x <= 709.0)) {
          if ((ize != 2) || (x <= 10000.0)) {
            iVar3 = (int)x;
            nsig = nb;
            if (x < 0.0001) {
              tempb = 1.0;
              emp2al = alpha + 1.0;
              _k = 0.0;
              if (8.9e-308 < x) {
                _k = x * 0.5;
              }
              if ((alpha != 0.0) || (NAN(alpha))) {
                dVar6 = pow(_k,alpha);
                dVar7 = tgamma(emp2al);
                tempb = dVar6 / dVar7;
              }
              if (ize == 2) {
                dVar6 = exp(-x);
                tempb = tempb * dVar6;
              }
              tempc = 0.0;
              if (1.0 < x + 1.0) {
                tempc = _k * _k;
              }
              *b = tempb + (tempb * tempc) / emp2al;
              if ((((x != 0.0) || (NAN(x))) && (*b == 0.0)) && (!NAN(*b))) {
                nsig = 0;
              }
              if (1 < nb) {
                if ((x != 0.0) || (NAN(x))) {
                  two = 1.78e-307 / x;
                  if ((tempc != 0.0) || (NAN(tempc))) {
                    two = 8.9e-308 / tempc;
                  }
                  for (ncalc = 2; ncalc <= nb; ncalc = ncalc + 1) {
                    dVar6 = tempb / emp2al;
                    emp2al = emp2al + 1.0;
                    tempb = dVar6 * _k;
                    if (tempb <= two * emp2al) {
                      tempb = 0.0;
                    }
                    b[ncalc + -1] = tempb + (tempb * tempc) / emp2al;
                    if (((b[ncalc + -1] == 0.0) && (!NAN(b[ncalc + -1]))) && (ncalc < nsig)) {
                      nsig = ncalc + -1;
                    }
                  }
                }
                else {
                  for (l = 1; l < nb; l = l + 1) {
                    b[l] = 0.0;
                  }
                }
              }
              x_local._4_4_ = nsig;
            }
            else {
              ncalc = iVar3 + 1;
              enmten = (double)(ncalc * 2) + alpha + alpha;
              pold = 1.0;
              plast = enmten / x;
              if (SBORROW4(0x50,iVar3 * 2) == iVar3 * -2 + 0x50 < 0) {
                _Var5 = std::pow<double,int>(1.585,iVar3);
                total = 2e+16 / _Var5;
              }
              else {
                total = sqrt(plast * 2e+16);
              }
              bVar1 = false;
              if (2 < nb - iVar3) {
                magx = iVar3 + 2;
                nstart = nb + -1;
LAB_001a572b:
                if (nstart < magx) goto LAB_001a5a2e;
                ncalc = magx;
                enmten = enmten + 2.0;
                dVar6 = (enmten * plast) / x + pold;
                if (dVar6 <= 1e+292) goto LAB_001a5a1a;
                rtnsig = plast / 1e+308;
                pold = rtnsig;
                dVar7 = dVar6 / 1e+308;
                iVar3 = ncalc;
                do {
                  ncalc = iVar3;
                  plast = dVar7;
                  dVar2 = pold;
                  enmten = enmten + 2.0;
                  pold = plast;
                  dVar7 = (enmten * plast) / x + dVar2;
                  iVar3 = ncalc + 1;
                } while (dVar7 <= 1.0);
                total = ((dVar2 * plast) / 1e+16) * (0.5 - 0.5 / ((enmten / x) * (enmten / x)));
                plast = plast * 1e+308;
                enmten = enmten - 2.0;
                nstart = i4_min(nb,ncalc);
                nsig = nstart + 1;
                psavel = dVar6 / 1e+308;
                do {
                  dVar6 = rtnsig;
                  n = magx + 1;
                  if (nstart < n) goto LAB_001a5a03;
                  rtnsig = psavel;
                  dVar6 = (enmten * psavel) / x + dVar6;
                  dVar7 = dVar6 * psavel;
                  psavel = dVar6;
                  magx = n;
                } while (dVar7 <= total);
                nsig = n;
LAB_001a5a03:
                nsig = nsig + -1;
                bVar1 = true;
LAB_001a5a2e:
                if (!bVar1) {
                  ncalc = nstart;
                  enmten = (double)(nstart * 2) + alpha + alpha;
                  dVar6 = sqrt(pold * 1e+16);
                  dVar7 = sqrt(plast + plast);
                  total = r8_max(total,dVar6 * dVar7);
                }
              }
              if (!bVar1) {
                do {
                  ncalc = ncalc + 1;
                  enmten = enmten + 2.0;
                  dVar6 = plast;
                  plast = (enmten * plast) / x + pold;
                  pold = dVar6;
                } while (plast < total);
              }
              iVar3 = ncalc + 1;
              enmten = enmten + 2.0;
              tempc = 0.0;
              tempb = 1.0 / plast;
              empal = (double)iVar3 - 1.0;
              emp2al = empal + alpha;
              en = (empal - 1.0) + alpha + alpha;
              tover = (tempb * emp2al * en) / empal;
              iVar4 = iVar3 - nb;
              if (iVar4 < 0) {
                b[ncalc] = tempb;
                for (n = 1; n <= -iVar4; n = n + 1) {
                  b[iVar3 + n + -1] = 0.0;
                }
                iVar4 = ncalc + -1;
                if (0 < iVar4) {
                  ncalc = iVar3;
                  for (n = 1; n <= iVar4; n = n + 1) {
                    iVar3 = ncalc + -1;
                    enmten = enmten - 2.0;
                    b[ncalc + -2] = (enmten * b[iVar3]) / x + b[ncalc];
                    empal = empal - 1.0;
                    en = en - 1.0;
                    if (iVar3 == 2) {
                      en = 1.0;
                    }
                    emp2al = emp2al - 1.0;
                    tover = ((b[ncalc + -2] * emp2al + tover) * en) / empal;
                    ncalc = iVar3;
                  }
                }
                *b = (emp2al * 2.0 * b[1]) / x + b[2];
                tover = tover + tover + *b;
              }
              else {
                ncalc = iVar3;
                if (0 < iVar4) {
                  for (n = 1; dVar6 = tempc, n <= iVar4; n = n + 1) {
                    ncalc = ncalc + -1;
                    enmten = enmten - 2.0;
                    tempc = tempb;
                    tempb = (enmten * tempb) / x + dVar6;
                    empal = empal - 1.0;
                    en = en - 1.0;
                    if (ncalc == 1) break;
                    if (ncalc == 2) {
                      en = 1.0;
                    }
                    emp2al = emp2al - 1.0;
                    tover = ((tempb * emp2al + tover) * en) / empal;
                  }
                }
                b[ncalc + -1] = tempb;
                if (nb < 2) {
                  tover = tover + tover + tempb;
                }
                else {
                  iVar3 = ncalc + -1;
                  enmten = enmten - 2.0;
                  b[ncalc + -2] = (enmten * tempb) / x + tempc;
                  if (1 < iVar3) {
                    empal = empal - 1.0;
                    en = en - 1.0;
                    if (iVar3 == 2) {
                      en = 1.0;
                    }
                    emp2al = emp2al - 1.0;
                    tover = ((b[ncalc + -2] * emp2al + tover) * en) / empal;
                    iVar4 = ncalc + -3;
                    if (0 < iVar4) {
                      ncalc = iVar3;
                      for (n = 1; n <= iVar4; n = n + 1) {
                        iVar3 = ncalc + -1;
                        enmten = enmten - 2.0;
                        b[ncalc + -2] = (enmten * b[iVar3]) / x + b[ncalc];
                        empal = empal - 1.0;
                        en = en - 1.0;
                        if (iVar3 == 2) {
                          en = 1.0;
                        }
                        emp2al = emp2al - 1.0;
                        tover = ((b[ncalc + -2] * emp2al + tover) * en) / empal;
                        ncalc = iVar3;
                      }
                    }
                    *b = (emp2al * 2.0 * b[1]) / x + b[2];
                  }
                  tover = tover + tover + *b;
                }
              }
              if ((alpha != 0.0) || (NAN(alpha))) {
                dVar6 = tgamma(alpha + 1.0);
                dVar7 = pow(x * 0.5,-alpha);
                tover = tover * dVar6 * dVar7;
              }
              if (ize == 1) {
                dVar6 = exp(-x);
                tover = tover * dVar6;
              }
              tempb = 8.9e-308;
              if (1.0 < tover) {
                tempb = tover * 8.9e-308;
              }
              for (ncalc = 1; ncalc <= nb; ncalc = ncalc + 1) {
                if (b[ncalc + -1] < tempb) {
                  b[ncalc + -1] = 0.0;
                }
                b[ncalc + -1] = b[ncalc + -1] / tover;
              }
              x_local._4_4_ = nsig;
            }
          }
          else {
            iVar3 = i4_min(nb,0);
            x_local._4_4_ = iVar3 + -1;
          }
        }
        else {
          iVar3 = i4_min(nb,0);
          x_local._4_4_ = iVar3 + -1;
        }
      }
      else {
        iVar3 = i4_min(nb,0);
        x_local._4_4_ = iVar3 + -1;
      }
    }
    else {
      iVar3 = i4_min(nb,0);
      x_local._4_4_ = iVar3 + -1;
    }
  }
  else {
    iVar3 = i4_min(nb,0);
    x_local._4_4_ = iVar3 + -1;
  }
  return x_local._4_4_;
LAB_001a5a1a:
  magx = magx + 1;
  pold = plast;
  plast = dVar6;
  goto LAB_001a572b;
}

Assistant:

int ribesl ( double x, double alpha, int nb, int ize, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    RIBESL calculates I Bessel function with non-integer orders.
//
//  Discussion:
//
//    This routine calculates Bessel functions I SUB(N+ALPHA) (X)
//    for non-negative argument X, and non-negative order N+ALPHA,
//    with or without exponential scaling.
//
//    This program is based on a program written by David
//    Sookne that computes values of the Bessel functions J or
//    I of real argument and integer order.  Modifications include
//    the restriction of the computation to the I Bessel function
//    of non-negative real argument, the extension of the computation
//    to arbitrary positive order, the inclusion of optional
//    exponential scaling, and the elimination of most underflow.
//
//    In case of an error, NCALC will not equal NB, and not all I's are
//    calculated to the desired accuracy.
//
//    If NCALC < 0:  An argument is out of range. For example,
//    NB <= 0, IZE is not 1 or 2, or IZE = 1 and EXPARG <= ABS(X)
//    In this case, the B-vector is not calculated, and NCALC is
//    set to MIN(NB,0)-1 so that NCALC /= NB.
//
//    If 0 < NCALC < NB, then not all requested function values could
//    be calculated accurately.  This usually occurs because NB is
//    much larger than ABS(X).  In this case, B(N) is calculated
//    to the desired accuracy for N <= NCALC, but precision
//    is lost for NCALC < N <= NB.  If B(N) does not vanish
//    for NCALC < N (because it is too small to be represented),
//    and B(N)/B(NCALC) = 10**(-K), then only the first NSIG-K
//    significant figures of B(N) can be trusted.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 March 2007
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Frank Olver, David Sookne,
//    A Note on Backward Recurrence Algorithms,
//    Mathematics of Computation,
//    Volume 26, 1972, pages 941-947.
//
//    David Sookne,
//    Bessel Functions of Real Argument and Integer Order,
//    NBS Journal of Research B,
//    Volume 77B, 1973, pages 125-132.
//
//    William Cody,
//    Algorithm 597:
//    Sequence of Modified Bessel Functions of the First Kind,
//    ACM Transactions of Mathematical Software,
//    Volume 9, Number 2, June 1983, pages 242-245.
//
//  Parameters:
//
//    Input, double X, the argument for which the functions
//    are to be calculated.
//
//    Input, double ALPHA,the fractional part of the order
//    for which the functions are to be calculated.
//    0 <= ALPHA < 1.0.
//
//    Input, int NB, the number of functions to be calculated.
//    The first function calculated is of order ALPHA, and the
//    last is of order (NB - 1 + ALPHA).  1 <= NB.
//
//    Input, int IZE, scaling option.
//    1, unscaled I's are to calculated,
//    2, exponentially scaled I's are to be calculated.
//
//    Output, double B[NB], the values of the functions
//    I(ALPHA,X) through I(NB-1+ALPHA,X), with scaling if requested.
//
//    Output, int RIBESL, the value of NCALC, the error indicator.
//    If NCALC = NB, then all the requested values were calculated
//    to the desired accuracy.
//
//  Local Parameeters:
//
//    BETA, the radix for the floating-point system.
//
//    MINEXP, smallest representable power of BETA.
//
//    MAXEXP, smallest power of BETA that overflows
//
//    IT, number of bits in the mantissa of a working precision variable.
//
//    NSIG, decimal significance desired.  Should be set to
//    INT(LOG10(2)*IT+1).  Setting NSIG lower will result
//    in decreased accuracy while setting NSIG higher will
//    increase CPU time without increasing accuracy.  The
//    truncation error is limited to a relative error of
//    T=.5*10^(-NSIG).
//
//    ENTEN, 10.0^K, where K is the largest integer such that
//    ENTEN is machine-representable in working precision
//
//    ENSIG, 10.0^NSIG
//
//    RTNSIG, 10.0^(-K) for the smallest integer K such that
//    NSIG/4 <= K.
//
//    ENMTEN, smallest ABS(X) such that X/4 does not underflow
//
//    XLARGE, upper limit on the magnitude of X when IZE=2.  Bear
//    in mind that if ABS(X)=N, then at least N iterations
//    of the backward recursion will be executed.  The value
//    of 10.0^4 is used on every machine.
//
//    EXPARG, largest working precision argument that the library
//    EXP routine can handle and upper limit on the
//    magnitude of X when IZE=1; approximately log(BETA^MAXEXP).
//
//    Approximate values for some important machines are:
//
//                        beta       minexp      maxexp       it
//
//  CRAY-1        (S.P.)    2        -8193        8191        48
//  Cyber 180/855
//    under NOS   (S.P.)    2         -975        1070        48
//  IEEE (IBM/XT,
//    SUN, etc.)  (S.P.)    2         -126         128        24
//  IEEE (IBM/XT,
//    SUN, etc.)  (D.P.)    2        -1022        1024        53
//  IBM 3033      (D.P.)   16          -65          63        14
//  VAX           (S.P.)    2         -128         127        24
//  VAX D-Format  (D.P.)    2         -128         127        56
//  VAX G-Format  (D.P.)    2        -1024        1023        53
//
//
//                        NSIG       ENTEN       ENSIG      RTNSIG
//
// CRAY-1        (S.P.)    15       1.0E+2465   1.0E+15     1.0E-4
// Cyber 180/855
//   under NOS   (S.P.)    15       1.0E+322    1.0E+15     1.0E-4
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)    16       1.0D+308    1.0D+16     1.0D-4
// IBM 3033      (D.P.)     5       1.0D+75     1.0D+5      1.0D-2
// VAX           (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// VAX D-Format  (D.P.)    17       1.0D+38     1.0D+17     1.0D-5
// VAX G-Format  (D.P.)    16       1.0D+307    1.0D+16     1.0D-4
//
//
//                         ENMTEN      XLARGE   EXPARG
//
// CRAY-1        (S.P.)   1.84E-2466   1.0E+4    5677
// Cyber 180/855
//   under NOS   (S.P.)   1.25E-293    1.0E+4     741
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)   4.70E-38     1.0E+4      88
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)   8.90D-308    1.0D+4     709
// IBM 3033      (D.P.)   2.16D-78     1.0D+4     174
// VAX           (S.P.)   1.17E-38     1.0E+4      88
// VAX D-Format  (D.P.)   1.17D-38     1.0D+4      88
// VAX G-Format  (D.P.)   2.22D-308    1.0D+4     709
//
{
  double constant = 1.585;
  double em;
  double empal;
  double emp2al;
  double en;
  double enmten = 8.9E-308;
  double ensig = 1.0E+16;
  double enten = 1.0E+308;
  double exparg = 709.0;
  bool flag;
  double half = 0.5;
  double halfx;
  int i;
  int k;
  int l;
  int magx;
  int n;
  int nbmx;
  int ncalc;
  int nend;
  int nsig = 16;
  int nstart;
  double one = 1.0;
  double p;
  double plast;
  double pold;
  double psave;
  double psavel;
  double rtnsig = 1.0E-04;
  double tempa;
  double tempb;
  double tempc;
  double test;
  double total;
  double tover;
  double two = 2.0;
  double xlarge = 1.0E+04;
  double zero = 0.0;
//
//  Check for X, NB, OR IZE out of range.
//
  if ( nb <= 0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( x < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( alpha < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( 1.0 <= alpha )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 1 && exparg < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 2 && xlarge < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }
//
//  Use 2-term ascending series for small X.
//
  ncalc = nb;
  magx = static_cast< int > (x);
//
//  Initialize the forward sweep, the P-sequence of Olver.
//
  if ( rtnsig <= x )
  {
    nbmx = nb - magx;
    n = magx + 1;
    en = static_cast<double>(n + n ) + ( alpha + alpha );
    plast = one;
    p = en / x;
//
//  Calculate general significance test.
//
    test = ensig + ensig;

    if ( 5 * nsig < 2 * magx )
    {
      test = sqrt ( test * p );
    }
    else
    {
      test = test / pow ( constant, magx );
    }
//
//  Calculate P-sequence until N = NB-1.  Check for possible overflow.
//
    flag = false;

    if ( 3 <= nbmx )
    {
      tover = enten / ensig;
      nstart = magx + 2;
      nend = nb - 1;

      for ( k = nstart; k <= nend; k++ )
      {
        n = k;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;
//
//  To avoid overflow, divide P-sequence by TOVER.  Calculate
//  P-sequence until 1 < ABS(P).
//
        if ( tover < p )
        {
          tover = enten;
          p = p / tover;
          plast = plast / tover;
          psave = p;
          psavel = plast;
          nstart = n + 1;

          for ( ; ; )
          {
            n = n + 1;
            en = en + two;
            pold = plast;
            plast = p;
            p = en * plast / x + pold;

            if ( 1.0 < p )
            {
              break;
            }
          }

          tempb = en / x;
//
//  Calculate backward test, and find NCALC, the highest N
//  such that the test is passed.
//
          test = pold * plast / ensig;
          test = test * ( half - half / ( tempb * tempb ) );
          p = plast * tover;
          n = n - 1;
          en = en - two;
          nend = i4_min ( nb, n );

          ncalc = nend + 1;

          for ( l = nstart; l <= nend; l++ )
          {
            pold = psavel;
            psavel = psave;
            psave = en * psavel / x + pold;

            if ( test < psave * psavel )
            {
              ncalc = l;
              break;
            }
          }
          ncalc = ncalc - 1;
          flag = true;
          break;
        }
      }

      if ( !flag )
      {
        n = nend;
        en = static_cast<double>(n + n ) + ( alpha + alpha );
//
//  Calculate special significance test for 2 < NBMX.
//
        test = r8_max ( test, sqrt ( plast * ensig ) * sqrt ( p + p ) );
      }
    }
//
//  Calculate P-sequence until significance test passed.
//
    if ( !flag )
    {
      for ( ; ; )
      {
        n = n + 1;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;

        if ( test <= p )
        {
          break;
        }
      }
    }
//
//  Initialize the backward recursion and the normalization sum.
//
    n = n + 1;
    en = en + two;
    tempb = zero;
    tempa = one / p;
    em = static_cast<double>(n ) - one;
    empal = em + alpha;
    emp2al = ( em - one ) + ( alpha + alpha );
    total = tempa * empal * emp2al / em;
    nend = n - nb;
//
//  N < NB, so store B(N) and set higher orders to zero.
//
    if ( nend < 0 )
    {
      b[n-1] = tempa;
      nend = -nend;

      for ( l = 1; l <= nend; l++ )
      {
        b[n+l-1] = zero;
      }

      nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          b[n-1] = ( en * b[n] ) / x + b[n+1];
          em = em - one;
          emp2al = emp2al - one;
          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;
        }
      }
//
//  Calculate B(1).
//
      b[0] = two * empal * b[1] / x + b[2];

      total = ( total + total ) + b[0];
    }
//
//  Recur backward via difference equation, calculating (but
//  not storing) B(N), until N = NB.
//
    else
    {
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          tempc = tempb;
          tempb = tempa;
          tempa = ( en * tempb ) / x + tempc;
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 1 )
          {
            break;
          }

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + tempa * empal ) * emp2al / em;
        }
      }
//
//  Store B(NB).
//
      b[n-1] = tempa;

      if ( nb <= 1 )
      {
        total = ( total + total ) + tempa;
      }
//
//  Calculate and Store B(NB-1).
//
      else
      {
        n = n - 1;
        en = en - two;
        b[n-1] = ( en * tempa ) / x + tempb;

        if ( 1 < n  )
        {
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;

          nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
          if ( 0 < nend )
          {
            for ( l = 1; l <= nend; l++ )
            {
              n = n - 1;
              en = en - two;
              b[n-1] = ( en * b[n] ) / x + b[n+1];
              em = em - one;
              emp2al = emp2al - one;
              if ( n == 2 )
              {
                emp2al = one;
              }
              empal = empal - one;
              total = ( total + b[n-1] * empal ) * emp2al / em;
            }
          }
//
//  Calculate B(1).
//
          b[0] = two * empal * b[1] / x + b[2];
        }
        total = ( total + total ) + b[0];
      }
    }
//
//  Normalize.  Divide all B(N) by TOTAL.
//
    if ( alpha != zero )
    {
       total = total * tgamma ( one + alpha ) * pow ( x * half, -alpha );
    }

    if ( ize == 1 )
    {
      total = total * exp ( -x );
    }

    tempa = enmten;

    if ( 1.0 < total )
    {
      tempa = tempa * total;
    }

    for ( n = 1; n <= nb; n++ )
    {
      if ( b[n-1] < tempa )
      {
        b[n-1] = zero;
      }
      b[n-1] = b[n-1] / total;
    }

    return ncalc;
  }
//
//  Two-term ascending series for small X.
//
  else
  {
    tempa = one;
    empal = one + alpha;
    halfx = zero;

    if ( enmten < x )
    {
      halfx = half * x;
    }

    if ( alpha != zero )
    {
      tempa = pow ( halfx, alpha ) / tgamma ( empal );
    }

    if ( ize == 2 )
    {
      tempa = tempa * exp ( - x );
    }

    tempb = zero;

    if ( one < x + one )
    {
      tempb = halfx * halfx;
    }

    b[0] = tempa + tempa * tempb / empal;

    if ( x != zero && b[0] == zero )
    {
      ncalc = 0;
    }

    if ( 1 < nb )
    {
      if ( x == zero )
      {
        for ( i = 1; i < nb; i++ )
        {
          b[i] = zero;
        }
      }
//
//  Calculate higher-order functions.
//
      else
      {
        tempc = halfx;
        tover = ( enmten + enmten ) / x;

        if ( tempb != zero )
        {
          tover = enmten / tempb;
        }

        for ( n = 2; n <= nb; n++ )
        {
          tempa = tempa / empal;
          empal = empal + one;
          tempa = tempa * tempc;

          if ( tempa <= tover * empal )
          {
            tempa = zero;
          }

          b[n-1] = tempa + tempa * tempb / empal;

          if ( b[n-1] == zero && n < ncalc )
          {
            ncalc = n - 1;
          }
        }
      }
    }
  }

  return ncalc;
}